

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t path_excluded(archive_match *a,wchar_t mbs,void *pathname)

{
  wchar_t wVar1;
  match *pmStack_38;
  wchar_t r;
  match *matched;
  match *match;
  void *pathname_local;
  wchar_t mbs_local;
  archive_match *a_local;
  
  if (a == (archive_match *)0x0) {
    a_local._4_4_ = L'\0';
  }
  else {
    pmStack_38 = (match *)0x0;
    for (matched = (a->inclusions).first; matched != (match *)0x0; matched = matched->next) {
      if ((matched->matched == 0) &&
         (wVar1 = match_path_inclusion(a,matched,mbs,pathname), wVar1 != L'\0')) {
        if (wVar1 < L'\0') {
          return wVar1;
        }
        (a->inclusions).unmatched_count = (a->inclusions).unmatched_count + L'\xffffffff';
        matched->matched = 1;
        pmStack_38 = matched;
      }
    }
    for (matched = (a->exclusions).first; matched != (match *)0x0; matched = matched->next) {
      wVar1 = match_path_exclusion(a,matched,mbs,pathname);
      if (wVar1 != L'\0') {
        return wVar1;
      }
    }
    if (pmStack_38 == (match *)0x0) {
      for (matched = (a->inclusions).first; matched != (match *)0x0; matched = matched->next) {
        if ((matched->matched != 0) &&
           (wVar1 = match_path_inclusion(a,matched,mbs,pathname), wVar1 != L'\0')) {
          if (wVar1 < L'\0') {
            return wVar1;
          }
          return L'\0';
        }
      }
      if ((a->inclusions).first == (match *)0x0) {
        a_local._4_4_ = L'\0';
      }
      else {
        a_local._4_4_ = L'\x01';
      }
    }
    else {
      a_local._4_4_ = L'\0';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
path_excluded(struct archive_match *a, int mbs, const void *pathname)
{
	struct match *match;
	struct match *matched;
	int r;

	if (a == NULL)
		return (0);

	/* Mark off any unmatched inclusions. */
	/* In particular, if a filename does appear in the archive and
	 * is explicitly included and excluded, then we don't report
	 * it as missing even though we don't extract it.
	 */
	matched = NULL;
	for (match = a->inclusions.first; match != NULL;
	    match = match->next){
		if (!match->matched &&
		    (r = match_path_inclusion(a, match, mbs, pathname)) != 0) {
			if (r < 0)
				return (r);
			a->inclusions.unmatched_count--;
			match->matched = 1;
			matched = match;
		}
	}

	/* Exclusions take priority */
	for (match = a->exclusions.first; match != NULL;
	    match = match->next){
		r = match_path_exclusion(a, match, mbs, pathname);
		if (r)
			return (r);
	}

	/* It's not excluded and we found an inclusion above, so it's
	 * included. */
	if (matched != NULL)
		return (0);


	/* We didn't find an unmatched inclusion, check the remaining ones. */
	for (match = a->inclusions.first; match != NULL;
	    match = match->next){
		/* We looked at previously-unmatched inclusions already. */
		if (match->matched &&
		    (r = match_path_inclusion(a, match, mbs, pathname)) != 0) {
			if (r < 0)
				return (r);
			return (0);
		}
	}

	/* If there were inclusions, default is to exclude. */
	if (a->inclusions.first != NULL)
	    return (1);

	/* No explicit inclusions, default is to match. */
	return (0);
}